

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

RangeValue __thiscall CoreML::RangeValue::operator+(RangeValue *this,RangeValue *other)

{
  undefined8 extraout_RAX;
  ulong uVar1;
  size_t sVar2;
  RangeValue RVar3;
  RangeValue retval;
  RangeValue local_30;
  RangeValue local_20;
  
  if (other->_isUnbound == true) {
    RangeValue(&local_20);
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_20._isUnbound);
  }
  else {
    sVar2 = value(other);
    RangeValue(&local_30);
    if (this->_isUnbound == false) {
      local_20._val = sVar2 + this->_val;
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)(uint)local_30._0_4_;
      local_20._val = local_30._val;
    }
  }
  RVar3._val = local_20._val;
  RVar3._0_8_ = uVar1;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator+ (const RangeValue& other) const {
    if (other.isUnbound())
        return RangeValue();
    else
        return (*this)+other.value();
}